

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,REF_INT node,REF_DBL *angle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  REF_CELL pRVar7;
  uint uVar8;
  int iVar9;
  double *in_RCX;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  undefined4 in_register_00000034;
  long lVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  double __x;
  double dVar17;
  double dVar18;
  REF_DBL dx2 [3];
  REF_DBL dx1 [3];
  double local_68 [4];
  double local_48 [3];
  
  lVar13 = CONCAT44(in_register_00000034,node);
  *in_RCX = 180.0;
  iVar10 = (int)angle;
  if (-1 < iVar10) {
    piVar6 = *(int **)(lVar13 + 0x40);
    if ((iVar10 < *piVar6) &&
       (lVar16 = (long)*(int *)(*(long *)(piVar6 + 2) + ((ulong)angle & 0xffffffff) * 4),
       lVar16 != -1)) {
      lVar14 = *(long *)(piVar6 + 4) + lVar16 * 8;
      do {
        if (((iVar10 < 0) || (piVar6 = *(int **)(lVar13 + 0x40), *piVar6 <= iVar10)) ||
           (iVar9 = *(int *)(*(long *)(piVar6 + 2) + ((ulong)angle & 0xffffffff) * 4), iVar9 == -1))
        {
          lVar14 = *(long *)(*(long *)(lVar13 + 0x40) + 0x10);
        }
        else {
          iVar1 = *(int *)(lVar14 + 4);
          lVar14 = *(long *)(piVar6 + 4);
          do {
            iVar2 = *(int *)(lVar14 + 4 + (long)iVar9 * 8);
            if (iVar1 != iVar2) {
              lVar14 = *(long *)(lVar13 + 0x38);
              lVar11 = (long)(*(int *)(lVar13 + 8) * iVar1);
              iVar3 = *(int *)(lVar14 + lVar11 * 4);
              iVar4 = *(int *)(lVar14 + 4 + lVar11 * 4);
              lVar11 = (long)(iVar2 * *(int *)(lVar13 + 8));
              iVar2 = *(int *)(lVar14 + lVar11 * 4);
              iVar5 = *(int *)(lVar14 + 4 + lVar11 * 4);
              pRVar7 = ref_grid->cell[5];
              lVar14 = 0;
              do {
                local_48[lVar14] =
                     *(double *)
                      (&pRVar7->type + (long)(((iVar3 - iVar10) + iVar4) * 0xf) * 2 + lVar14 * 2) -
                     *(double *)(&pRVar7->type + (ulong)(uint)(iVar10 * 0xf) * 2 + lVar14 * 2);
                local_68[lVar14] =
                     *(double *)
                      (&pRVar7->type + (long)(((iVar2 - iVar10) + iVar5) * 0xf) * 2 + lVar14 * 2) -
                     *(double *)(&pRVar7->type + (ulong)(uint)(iVar10 * 0xf) * 2 + lVar14 * 2);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              uVar8 = ref_math_normalize(local_48);
              if (uVar8 != 0) {
                pcVar15 = "dx1";
                uVar12 = 0xa5c;
LAB_0014b976:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,uVar12,"ref_geom_node_min_angle",(ulong)uVar8,pcVar15);
                return uVar8;
              }
              uVar8 = ref_math_normalize(local_68);
              if (uVar8 != 0) {
                pcVar15 = "dx2";
                uVar12 = 0xa5d;
                goto LAB_0014b976;
              }
              __x = local_48[2] * local_68[2] +
                    local_48[0] * local_68[0] + local_48[1] * local_68[1];
              dVar18 = *in_RCX;
              dVar17 = acos(__x);
              if ((dVar17 * 180.0) / 3.14159265358979 <= dVar18) {
                dVar18 = acos(__x);
                dVar18 = (dVar18 * 180.0) / 3.14159265358979;
              }
              else {
                dVar18 = *in_RCX;
              }
              *in_RCX = dVar18;
            }
            lVar14 = *(long *)(*(long *)(lVar13 + 0x40) + 0x10);
            iVar9 = *(int *)(lVar14 + (long)iVar9 * 8);
          } while (iVar9 != -1);
        }
        lVar16 = (long)*(int *)(lVar14 + (long)(int)lVar16 * 8);
        if (lVar16 == -1) {
          return 0;
        }
        lVar14 = lVar14 + lVar16 * 8;
      } while( true );
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,
                                                  REF_INT node,
                                                  REF_DBL *angle) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item1, cell1, node1;
  REF_INT item2, cell2, node2;
  REF_INT i;
  REF_DBL dot, dx1[3], dx2[3];
  *angle = 180.0;
  each_ref_cell_having_node(ref_cell, node, item1, cell1) {
    each_ref_cell_having_node(ref_cell, node, item2, cell2) {
      if (cell1 == cell2) continue; /* skip same edge */
      node1 = ref_cell_c2n(ref_cell, 0, cell1) +
              ref_cell_c2n(ref_cell, 1, cell1) - node;
      node2 = ref_cell_c2n(ref_cell, 0, cell2) +
              ref_cell_c2n(ref_cell, 1, cell2) - node;
      for (i = 0; i < 3; i++) {
        dx1[i] =
            ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
        dx2[i] =
            ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
      }
      RSS(ref_math_normalize(dx1), "dx1");
      RSS(ref_math_normalize(dx2), "dx2");
      dot = ref_math_dot(dx1, dx2);
      *angle = MIN(*angle, ref_math_in_degrees(acos(dot)));
    }
  }
  return REF_SUCCESS;
}